

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_simplex_and_subfaces<std::initializer_list<int>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,initializer_list<int> *Nsimplex,
          Filtration_value *filtration)

{
  Filtration_value FVar1;
  Filtration_value FVar2;
  long lVar3;
  Filtration_value *filt;
  long lVar4;
  int iVar5;
  ulong uVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  long lVar8;
  undefined8 *puVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar11;
  
  FVar1 = filtration[1];
  if (FVar1 == 0.0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    FVar2 = *filtration;
    if ((char)in_FS_OFFSET[-0xd] == '\0') {
      insert_simplex_and_subfaces<std::initializer_list<int>>();
    }
    if (in_FS_OFFSET[-0xf] != in_FS_OFFSET[-0x10]) {
      in_FS_OFFSET[-0xf] = in_FS_OFFSET[-0x10];
    }
    std::vector<int,std::allocator<int>>::_M_range_insert<int_const*>
              ((vector<int,std::allocator<int>> *)(*in_FS_OFFSET + -0x80),in_FS_OFFSET[-0xf],FVar2,
               (long)FVar2 + (long)FVar1 * 4);
    lVar8 = in_FS_OFFSET[-0x10];
    lVar3 = in_FS_OFFSET[-0xf];
    if (lVar8 != lVar3) {
      uVar6 = lVar3 - lVar8 >> 2;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar8,lVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar8,lVar3);
    }
    _Var7 = std::
            __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (in_FS_OFFSET[-0x10],in_FS_OFFSET[-0xf]);
    if ((_Var7._M_current != (int *)in_FS_OFFSET[-0xf]) &&
       (lVar8 = (long)_Var7._M_current + (in_FS_OFFSET[-0xf] - in_FS_OFFSET[-0xf]),
       in_FS_OFFSET[-0xf] != lVar8)) {
      in_FS_OFFSET[-0xf] = lVar8;
    }
    _Var7._M_current = (int *)in_FS_OFFSET[-0x10];
    filt = (Filtration_value *)in_FS_OFFSET[-0xf];
    if ((Filtration_value *)_Var7._M_current != filt) {
      _Var10._M_current = _Var7._M_current;
      do {
        if (*_Var10._M_current == (int)Nsimplex[3]._M_len) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = "cannot use the dummy null_vertex() as a real vertex";
          __cxa_throw(puVar9,&char_const*::typeinfo,0);
        }
        _Var10._M_current = _Var10._M_current + 4;
      } while ((Filtration_value *)_Var10._M_current != filt);
    }
    iVar5 = (int)((ulong)((long)filt - (long)_Var7._M_current) >> 2) + -1;
    if (iVar5 < *(int *)&Nsimplex[8]._M_array) {
      iVar5 = *(int *)&Nsimplex[8]._M_array;
    }
    *(int *)&Nsimplex[8]._M_array = iVar5;
    pVar11 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (Nsimplex + 4),_Var7,filt);
    filtration = pVar11._8_8_;
  }
  pVar11._8_8_ = filtration;
  pVar11.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)this;
  return pVar11;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }